

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function_binder.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::TableFunctionBinder::BindColumnReference
          (BindResult *__return_storage_ptr__,TableFunctionBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  long *plVar1;
  Binder *pBVar2;
  optional_idx error_location;
  pointer pcVar3;
  string *psVar4;
  _func_int **pp_Var5;
  bool bVar6;
  BaseExpression *pBVar7;
  ColumnRefExpression *this_00;
  LambdaRefExpression *expr;
  BoundConstantExpression *this_01;
  BinderException *pBVar8;
  ParameterNotResolvedException *this_02;
  optional_ptr<duckdb::DummyBinding,_true> *this_03;
  undefined7 in_register_00000081;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  value_function;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  lambda_ref;
  string result_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  string column_name;
  undefined1 local_248 [8];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_240;
  undefined4 local_234;
  LambdaRefExpression local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1d0;
  undefined1 local_1b8 [32];
  undefined1 local_198 [16];
  _Alloc_hider local_188;
  char local_178 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_168 [56];
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [128];
  
  local_234 = (undefined4)CONCAT71(in_register_00000081,root_expression);
  pBVar7 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            ::operator->(expr_ptr)->super_BaseExpression;
  this_00 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar7);
  bVar6 = ColumnRefExpression::IsQualified(this_00);
  if (!bVar6) {
    (*(this_00->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
              ((string *)local_1b8,this_00);
    LambdaRefExpression::FindMatchingBinding
              (&local_230,&(this->super_ExpressionBinder).lambda_bindings,(string *)local_1b8);
    pp_Var5 = local_230.super_ParsedExpression.super_BaseExpression._vptr_BaseExpression;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_230.super_ParsedExpression.super_BaseExpression._vptr_BaseExpression ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pBVar2 = (this->super_ExpressionBinder).binder;
      if ((pBVar2->macro_binding).ptr != (DummyBinding *)0x0) {
        this_03 = &pBVar2->macro_binding;
        optional_ptr<duckdb::DummyBinding,_true>::CheckValid(this_03);
        bVar6 = Binding::HasMatchingBinding(&this_03->ptr->super_Binding,(string *)local_1b8);
        if (bVar6) {
          this_02 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
          ParameterNotResolvedException::ParameterNotResolvedException(this_02);
          __cxa_throw(this_02,&ParameterNotResolvedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
      }
    }
    else {
      pBVar7 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)&local_230)->super_BaseExpression;
      expr = BaseExpression::Cast<duckdb::LambdaRefExpression>(pBVar7);
      BindLambdaReference(__return_storage_ptr__,this,expr,depth);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_230.super_ParsedExpression.super_BaseExpression._vptr_BaseExpression !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (**(code **)(((_Alloc_hider *)
                   local_230.super_ParsedExpression.super_BaseExpression._vptr_BaseExpression)->_M_p
                  + 8))();
    }
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pp_Var5 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return __return_storage_ptr__;
    }
  }
  error_location.index = (this_00->super_ParsedExpression).super_BaseExpression.query_location.index
  ;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_1d0,
           &(this_00->column_names).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  plVar1 = (long *)(local_1b8 + 0x10);
  local_1b8._0_8_ = plVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,".","");
  StringUtil::Join(&local_230.column_name,&local_1d0,(string *)local_1b8);
  if ((long *)local_1b8._0_8_ != plVar1) {
    operator_delete((void *)local_1b8._0_8_);
  }
  if ((this->table_function_name)._M_string_length != 0) {
    local_230.super_ParsedExpression.super_BaseExpression._vptr_BaseExpression =
         (_func_int **)&local_230.super_ParsedExpression.super_BaseExpression.alias;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"error","");
    ErrorData::ErrorData((ErrorData *)local_b0,(string *)&local_230);
    ExpressionBinder::BindCorrelatedColumns
              ((BindResult *)local_1b8,&this->super_ExpressionBinder,expr_ptr,(ErrorData *)local_b0)
    ;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_b0 + 0x48));
    if ((undefined1 *)local_b0._40_8_ != local_b0 + 0x38) {
      operator_delete((void *)local_b0._40_8_);
    }
    psVar4 = &local_230.super_ParsedExpression.super_BaseExpression.alias;
    if ((undefined1 *)local_b0._8_8_ != local_b0 + 0x18) {
      operator_delete((void *)local_b0._8_8_);
    }
    if ((string *)local_230.super_ParsedExpression.super_BaseExpression._vptr_BaseExpression !=
        psVar4) {
      operator_delete(local_230.super_ParsedExpression.super_BaseExpression._vptr_BaseExpression);
    }
    if (local_1b8[8] == false) {
      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
      local_230.super_ParsedExpression.super_BaseExpression._vptr_BaseExpression =
           (_func_int **)psVar4;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,
                 "Table function \"%s\" does not support lateral join column parameters - cannot use column \"%s\" in this context.\nThe function only supports literals as parameters."
                 ,"");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      pcVar3 = (this->table_function_name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar3,pcVar3 + (this->table_function_name)._M_string_length);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_230.column_name._M_dataplus._M_p,
                 (long)&(((string *)local_230.column_name._M_string_length)->_M_dataplus)._M_p +
                 local_230.column_name._M_dataplus._M_p);
      BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                (pBVar8,error_location,(string *)&local_230,&local_d0,&local_f0);
      __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_168);
    if (local_188._M_p != local_178) {
      operator_delete(local_188._M_p);
    }
    if ((undefined1 *)local_1b8._16_8_ != local_198) {
      operator_delete((void *)local_1b8._16_8_);
    }
    if ((long *)local_1b8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._0_8_ + 8))();
    }
  }
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  back(&local_1d0);
  ExpressionBinder::GetSQLValueFunction((ExpressionBinder *)local_248,(string *)this);
  if (local_248 == (undefined1  [8])0x0) {
    if ((this->table_function_name)._M_string_length == 0) {
      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
      local_1b8._0_8_ = plVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,
                 "Failed to bind \"%s\" - COLUMNS expression can only contain lambda parameters","")
      ;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,local_230.column_name._M_dataplus._M_p,
                 (long)&(((string *)local_230.column_name._M_string_length)->_M_dataplus)._M_p +
                 local_230.column_name._M_dataplus._M_p);
      BinderException::BinderException<std::__cxx11::string>
                (pBVar8,error_location,(string *)local_1b8,&local_110);
      __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_230.column_name._M_dataplus._M_p,
               (long)&(((string *)local_230.column_name._M_string_length)->_M_dataplus)._M_p +
               local_230.column_name._M_dataplus._M_p);
    Value::Value((Value *)&local_230,&local_130);
    this_01 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value((Value *)local_1b8,(Value *)&local_230);
    BoundConstantExpression::BoundConstantExpression(this_01,(Value *)local_1b8);
    Value::~Value((Value *)local_1b8);
    local_240._M_head_impl = (Expression *)this_01;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_240);
    if ((BoundConstantExpression *)local_240._M_head_impl != (BoundConstantExpression *)0x0) {
      (*(((Expression *)&(local_240._M_head_impl)->super_BaseExpression)->super_BaseExpression).
        _vptr_BaseExpression[1])();
    }
    local_240._M_head_impl = (Expression *)0x0;
    Value::~Value((Value *)&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  else {
    (*(this->super_ExpressionBinder)._vptr_ExpressionBinder[5])
              (__return_storage_ptr__,this,local_248,depth,(ulong)(byte)local_234);
  }
  if (local_248 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_248 + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.column_name._M_dataplus._M_p != &local_230.column_name.field_2) {
    operator_delete(local_230.column_name._M_dataplus._M_p);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1d0);
  return __return_storage_ptr__;
}

Assistant:

BindResult TableFunctionBinder::BindColumnReference(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth,
                                                    bool root_expression) {
	// try binding as a lambda parameter
	auto &col_ref = expr_ptr->Cast<ColumnRefExpression>();
	if (!col_ref.IsQualified()) {
		auto column_name = col_ref.GetName();
		auto lambda_ref = LambdaRefExpression::FindMatchingBinding(lambda_bindings, column_name);
		if (lambda_ref) {
			return BindLambdaReference(lambda_ref->Cast<LambdaRefExpression>(), depth);
		}
		if (binder.macro_binding && binder.macro_binding->HasMatchingBinding(column_name)) {
			throw ParameterNotResolvedException();
		}
	}
	auto query_location = col_ref.GetQueryLocation();
	auto column_names = col_ref.column_names;
	auto result_name = StringUtil::Join(column_names, ".");
	if (!table_function_name.empty()) {
		// check if this is a lateral join column/parameter
		auto result = BindCorrelatedColumns(expr_ptr, ErrorData("error"));
		if (!result.HasError()) {
			// it is a lateral join parameter - this is not supported in this type of table function
			throw BinderException(query_location,
			                      "Table function \"%s\" does not support lateral join column parameters - cannot use "
			                      "column \"%s\" in this context.\nThe function only supports literals as parameters.",
			                      table_function_name, result_name);
		}
	}

	auto value_function = ExpressionBinder::GetSQLValueFunction(column_names.back());
	if (value_function) {
		return BindExpression(value_function, depth, root_expression);
	}
	if (table_function_name.empty()) {
		throw BinderException(query_location,
		                      "Failed to bind \"%s\" - COLUMNS expression can only contain lambda parameters",
		                      result_name);
	}

	return BindResult(make_uniq<BoundConstantExpression>(Value(result_name)));
}